

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O2

void __thiscall setup::data_entry::load(data_entry *this,istream *is,info *i)

{
  flags *this_00;
  ostringstream *this_01;
  tm tm;
  undefined1 auVar1 [48];
  byte bVar2;
  uint16_t uVar3;
  unsigned_short uVar4;
  unsigned_short uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint uVar8;
  sign_mode sVar9;
  logger *plVar10;
  unsigned_long uVar11;
  time tVar12;
  flag_type fVar13;
  _Base_bitset<1UL> _Var14;
  compression_method cVar15;
  char *in_stack_fffffffffffffde0;
  stored_flag_reader<flags<setup::data_entry::flags_Enum_,_12UL>_> flagreader;
  logger local_1b0;
  
  uVar3 = version::bits(&i->version);
  uVar6 = util::load<unsigned_int,util::little_endian>(is,(ulong)uVar3);
  (this->chunk).first_slice = uVar6;
  uVar3 = version::bits(&i->version);
  uVar6 = util::load<unsigned_int,util::little_endian>(is,(ulong)uVar3);
  (this->chunk).last_slice = uVar6;
  if ((i->version).value < 0x4000000) {
    uVar7 = (this->chunk).first_slice;
    if (uVar6 == 0 || uVar7 == 0) {
      local_1b0.level = Warning;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.buffer);
      std::operator<<((ostream *)&local_1b0.buffer,"Unexpected slice number: ");
      plVar10 = logger::operator<<(&local_1b0,(uint *)this);
      std::operator<<((ostream *)&plVar10->buffer," to ");
      logger::operator<<(plVar10,&(this->chunk).last_slice);
      logger::~logger(&local_1b0);
    }
    else {
      (this->chunk).first_slice = uVar7 - 1;
      (this->chunk).last_slice = uVar6 - 1;
    }
  }
  uVar6 = util::load<int,util::little_endian>(is);
  (this->chunk).offset = uVar6;
  (this->chunk).sort_offset = uVar6;
  uVar6 = (i->version).value;
  if (uVar6 < 0x4000100) {
    uVar11 = 0;
  }
  else {
    uVar11 = util::load<long,util::little_endian>(is);
    uVar6 = (i->version).value;
  }
  (this->file).offset = uVar11;
  if (uVar6 < 0x4000000) {
    uVar6 = util::load<int,util::little_endian>(is);
    (this->file).size = (ulong)uVar6;
    uVar6 = util::load<int,util::little_endian>(is);
    uVar11 = (unsigned_long)uVar6;
  }
  else {
    uVar11 = util::load<long,util::little_endian>(is);
    (this->file).size = uVar11;
    uVar11 = util::load<long,util::little_endian>(is);
  }
  (this->chunk).size = uVar11;
  this->uncompressed_size = (this->file).size;
  uVar6 = (i->version).value;
  if (uVar6 < 0x6040000) {
    if (uVar6 < 0x5030900) {
      if (uVar6 < 0x4020000) {
        uVar8 = util::load<int,util::little_endian>(is);
        (this->file).checksum.field_0.adler32 = uVar8;
        if (uVar6 < 0x4000100) {
          (this->file).checksum.type = Adler32;
        }
        else {
          (this->file).checksum.type = CRC32;
        }
      }
      else {
        std::istream::read((char *)is,(long)&(this->file).checksum);
        (this->file).checksum.type = MD5;
      }
    }
    else {
      std::istream::read((char *)is,(long)&(this->file).checksum);
      (this->file).checksum.type = SHA1;
    }
  }
  else {
    std::istream::read((char *)is,(long)&(this->file).checksum);
    (this->file).checksum.type = SHA256;
  }
  uVar3 = version::bits(&i->version);
  if (uVar3 == 0x10) {
    uVar4 = util::load<short,util::little_endian>(is);
    uVar5 = util::load<short,util::little_endian>(is);
    auVar1 = ZEXT1648(CONCAT88(CONCAT44((uVar5 >> 9) + 0x50,(uVar5 >> 5 & 0xf) - 1),
                               (ulong)CONCAT24(uVar5,(uint)(uVar4 >> 0xb)) & 0x1fffffffff));
    tm.tm_zone = in_stack_fffffffffffffde0;
    tm.tm_sec = auVar1._0_4_;
    tm.tm_min = auVar1._4_4_;
    tm.tm_hour = auVar1._8_4_;
    tm.tm_mday = auVar1._12_4_;
    tm.tm_mon = auVar1._16_4_;
    tm.tm_year = auVar1._20_4_;
    tm.tm_wday = auVar1._24_4_;
    tm.tm_yday = auVar1._28_4_;
    tm.tm_isdst = auVar1._32_4_;
    tm._36_4_ = auVar1._36_4_;
    tm.tm_gmtoff = auVar1._40_8_;
    tVar12 = util::parse_time(tm);
    this->timestamp = tVar12;
    uVar7 = 0;
  }
  else {
    uVar11 = util::load<long,util::little_endian>(is);
    if ((long)uVar11 < 0x19db1ded53e8000) {
      this_01 = &local_1b0.buffer;
      local_1b0.level = Warning;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
      std::operator<<((ostream *)this_01,"Unexpected filetime: ");
      std::ostream::_M_insert<long>((long)this_01);
      logger::~logger(&local_1b0);
    }
    this->timestamp = (long)(uVar11 + 0xfe624e212ac18000) / 10000000;
    uVar7 = (int)((long)(uVar11 + 0xfe624e212ac18000) % 10000000) * 100;
  }
  this->timestamp_nsec = uVar7;
  uVar6 = util::load<int,util::little_endian>(is);
  uVar8 = util::load<int,util::little_endian>(is);
  this->file_version = CONCAT44(uVar6,uVar8);
  this_00 = &this->options;
  (this->options)._flags.super__Base_bitset<1UL>._M_w = 0;
  uVar3 = version::bits(&i->version);
  flagreader.super_stored_flag_reader<setup::data_entry::flags_Enum_>.pad_bits = (size_t)uVar3;
  flagreader.super_stored_flag_reader<setup::data_entry::flags_Enum_>.pos = 0;
  flagreader.super_stored_flag_reader<setup::data_entry::flags_Enum_>.buffer = '\0';
  flagreader.super_stored_flag_reader<setup::data_entry::flags_Enum_>.result._flags.
  super__Base_bitset<1UL>._M_w = (Type)(_Base_bitset<1UL>)0x0;
  flagreader.super_stored_flag_reader<setup::data_entry::flags_Enum_>.bytes = 0;
  flagreader.super_stored_flag_reader<setup::data_entry::flags_Enum_>.stream = is;
  stored_flag_reader<setup::data_entry::flags_Enum_>::add
            (&flagreader.super_stored_flag_reader<setup::data_entry::flags_Enum_>,VersionInfoValid);
  stored_flag_reader<setup::data_entry::flags_Enum_>::add
            (&flagreader.super_stored_flag_reader<setup::data_entry::flags_Enum_>,
             VersionInfoNotValid);
  uVar6 = (i->version).value;
  if (0x20010ff < uVar6) {
    if (uVar6 < 0x4000100) {
      stored_flag_reader<setup::data_entry::flags_Enum_>::add
                (&flagreader.super_stored_flag_reader<setup::data_entry::flags_Enum_>,BZipped);
      uVar6 = (i->version).value;
    }
    if (0x40009ff < uVar6) {
      stored_flag_reader<setup::data_entry::flags_Enum_>::add
                (&flagreader.super_stored_flag_reader<setup::data_entry::flags_Enum_>,TimeStampInUTC
                );
      if (0x400ffff < (i->version).value) {
        stored_flag_reader<setup::data_entry::flags_Enum_>::add
                  (&flagreader.super_stored_flag_reader<setup::data_entry::flags_Enum_>,
                   IsUninstallerExe);
        if (0x40107ff < (i->version).value) {
          stored_flag_reader<setup::data_entry::flags_Enum_>::add
                    (&flagreader.super_stored_flag_reader<setup::data_entry::flags_Enum_>,
                     CallInstructionOptimized);
          if (0x401ffff < (i->version).value) {
            stored_flag_reader<setup::data_entry::flags_Enum_>::add
                      (&flagreader.super_stored_flag_reader<setup::data_entry::flags_Enum_>,Touch);
            if (0x40201ff < (i->version).value) {
              stored_flag_reader<setup::data_entry::flags_Enum_>::add
                        (&flagreader.super_stored_flag_reader<setup::data_entry::flags_Enum_>,
                         ChunkEncrypted);
              if (0x40204ff < (i->version).value) {
                stored_flag_reader<setup::data_entry::flags_Enum_>::add
                          (&flagreader.super_stored_flag_reader<setup::data_entry::flags_Enum_>,
                           ChunkCompressed);
                goto LAB_0012f8dd;
              }
            }
          }
        }
      }
    }
  }
  flags<setup::data_entry::flags_Enum_,_12UL>::operator|=(this_00,ChunkCompressed);
LAB_0012f8dd:
  if (0x5010cff < (i->version).value) {
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::data_entry::flags_Enum_>,SolidBreak);
    if ((i->version).value + 0xfafaf900 < 0xfdf900) {
      stored_flag_reader<setup::data_entry::flags_Enum_>::add
                (&flagreader.super_stored_flag_reader<setup::data_entry::flags_Enum_>,Sign);
      stored_flag_reader<setup::data_entry::flags_Enum_>::add
                (&flagreader.super_stored_flag_reader<setup::data_entry::flags_Enum_>,SignOnce);
    }
  }
  fVar13 = stored_flag_reader<setup::data_entry::flags_Enum_>::finalize
                     (&flagreader.super_stored_flag_reader<setup::data_entry::flags_Enum_>);
  (this_00->_flags).super__Base_bitset<1UL>._M_w =
       (this_00->_flags).super__Base_bitset<1UL>._M_w |
       (ulong)fVar13._flags.super__Base_bitset<1UL>._M_w;
  if ((i->version).value < 0x6030000) {
    _Var14._M_w = (_WordT)flags<setup::data_entry::flags_Enum_,_12UL>::operator&(this_00,SignOnce);
    if ((_Base_bitset<1UL>)_Var14._M_w == (_Base_bitset<1UL>)0x0) {
      _Var14._M_w = (_WordT)flags<setup::data_entry::flags_Enum_,_12UL>::operator&(this_00,Sign);
      if ((_Base_bitset<1UL>)_Var14._M_w == (_Base_bitset<1UL>)0x0) {
        this->sign = NoSetting;
      }
      else {
        this->sign = Yes;
      }
    }
    else {
      this->sign = Once;
    }
  }
  else {
    bVar2 = util::load<unsigned_char,util::little_endian>(is);
    if (bVar2 < 4) {
      sVar9 = *(sign_mode *)("[expand 32-byte k" + (ulong)bVar2 * 4 + 0x11);
    }
    else {
      local_1b0.level = Warning;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.buffer);
      std::operator<<((ostream *)&local_1b0.buffer,"Unexpected ");
      plVar10 = logger::operator<<(&local_1b0,&enum_names<setup::data_entry::sign_mode>::name);
      std::operator<<((ostream *)&plVar10->buffer," value: ");
      std::ostream::_M_insert<unsigned_long>((ulong)&plVar10->buffer);
      logger::~logger(&local_1b0);
      sVar9 = NoSetting;
    }
    this->sign = sVar9;
  }
  _Var14._M_w = (_WordT)flags<setup::data_entry::flags_Enum_,_12UL>::operator&
                                  (this_00,ChunkCompressed);
  cVar15 = Stored;
  if ((_Base_bitset<1UL>)_Var14._M_w != (_Base_bitset<1UL>)0x0) {
    cVar15 = (i->header).compression;
  }
  (this->chunk).compression = cVar15;
  _Var14._M_w = (_WordT)flags<setup::data_entry::flags_Enum_,_12UL>::operator&(this_00,BZipped);
  if ((_Base_bitset<1UL>)_Var14._M_w != (_Base_bitset<1UL>)0x0) {
    flags<setup::data_entry::flags_Enum_,_12UL>::operator|=(this_00,ChunkCompressed);
    (this->chunk).compression = BZip2;
  }
  _Var14._M_w = (_WordT)flags<setup::data_entry::flags_Enum_,_12UL>::operator&
                                  (this_00,ChunkEncrypted);
  if ((_Base_bitset<1UL>)_Var14._M_w == (_Base_bitset<1UL>)0x0) {
    (this->chunk).encryption = Plaintext;
  }
  else {
    uVar6 = (i->version).value;
    if (uVar6 < 0x6040000) {
      if (uVar6 < 0x5030900) {
        (this->chunk).encryption = ARC4_MD5;
      }
      else {
        (this->chunk).encryption = ARC4_SHA1;
      }
    }
    else {
      (this->chunk).encryption = XChaCha20;
    }
  }
  _Var14._M_w = (_WordT)flags<setup::data_entry::flags_Enum_,_12UL>::operator&
                                  (this_00,CallInstructionOptimized);
  if ((_Base_bitset<1UL>)_Var14._M_w == (_Base_bitset<1UL>)0x0) {
    (this->file).filter = NoFilter;
  }
  else {
    uVar6 = (i->version).value;
    if (uVar6 < 0x5020000) {
      (this->file).filter = InstructionFilter4108;
    }
    else if (uVar6 < 0x5030900) {
      (this->file).filter = InstructionFilter5200;
    }
    else {
      (this->file).filter = InstructionFilter5309;
    }
  }
  return;
}

Assistant:

void data_entry::load(std::istream & is, const info & i) {
	
	chunk.first_slice = util::load<boost::uint32_t>(is, i.version.bits());
	chunk.last_slice = util::load<boost::uint32_t>(is, i.version.bits());
	if(i.version < INNO_VERSION(4, 0, 0)) {
		if(chunk.first_slice < 1 || chunk.last_slice < 1) {
			log_warning << "Unexpected slice number: " << chunk.first_slice
			            << " to " << chunk.last_slice;
		} else {
			chunk.first_slice--, chunk.last_slice--;
		}
	}
	
	chunk.sort_offset = chunk.offset = util::load<boost::uint32_t>(is);
	
	if(i.version >= INNO_VERSION(4, 0, 1)) {
		file.offset = util::load<boost::uint64_t>(is);
	} else {
		file.offset = 0;
	}
	
	if(i.version >= INNO_VERSION(4, 0, 0)) {
		file.size = util::load<boost::uint64_t>(is);
		chunk.size = util::load<boost::uint64_t>(is);
	} else {
		file.size = util::load<boost::uint32_t>(is);
		chunk.size = util::load<boost::uint32_t>(is);
	}
	uncompressed_size = file.size;
	
	if(i.version >= INNO_VERSION(6, 4, 0)) {
		is.read(file.checksum.sha256, std::streamsize(sizeof(file.checksum.sha256)));
		file.checksum.type = crypto::SHA256;
	} else if(i.version >= INNO_VERSION(5, 3, 9)) {
		is.read(file.checksum.sha1, std::streamsize(sizeof(file.checksum.sha1)));
		file.checksum.type = crypto::SHA1;
	} else if(i.version >= INNO_VERSION(4, 2, 0)) {
		is.read(file.checksum.md5, std::streamsize(sizeof(file.checksum.md5)));
		file.checksum.type = crypto::MD5;
	} else if(i.version >= INNO_VERSION(4, 0, 1)) {
		file.checksum.crc32 = util::load<boost::uint32_t>(is);
		file.checksum.type = crypto::CRC32;
	} else {
		file.checksum.adler32 = util::load<boost::uint32_t>(is);
		file.checksum.type = crypto::Adler32;
	}
	
	if(i.version.bits() == 16) {
		
		// 16-bit installers use the FAT filetime format
		
		boost::uint16_t time = util::load<boost::uint16_t>(is);
		boost::uint16_t date = util::load<boost::uint16_t>(is);
		
		struct tm t;
		std::memset(&t, 0, sizeof(t));
		t.tm_sec  = util::get_bits(time,  0,  4) * 2;           // [0, 58]
		t.tm_min  = util::get_bits(time,  5, 10);               // [0, 59]
		t.tm_hour = util::get_bits(time, 11, 15);               // [0, 23]
		t.tm_mday = util::get_bits(date,  0,  4);               // [1, 31]
		t.tm_mon  = util::get_bits(date,  5,  8) - 1;           // [0, 11]
		t.tm_year = util::get_bits(date,  9, 15) + 1980 - 1900; // [80, 199]
		
		timestamp = util::parse_time(t);
		timestamp_nsec = 0;
		
	} else {
		
		// 32-bit installers use the Win32 FILETIME format
		
		boost::int64_t filetime = util::load<boost::int64_t>(is);
		
		static const boost::int64_t FiletimeOffset = 0x19DB1DED53E8000ll;
		if(filetime < FiletimeOffset) {
			log_warning << "Unexpected filetime: " << filetime;
		}
		filetime -= FiletimeOffset;
		
		timestamp = filetime / 10000000;
		timestamp_nsec = boost::uint32_t(filetime % 10000000) * 100;
		
	}
	
	boost::uint32_t file_version_ms = util::load<boost::uint32_t>(is);
	boost::uint32_t file_version_ls = util::load<boost::uint32_t>(is);
	file_version = (boost::uint64_t(file_version_ms) << 32)
	             |  boost::uint64_t(file_version_ls);
	
	options = 0;
	
	stored_flag_reader<flags> flagreader(is, i.version.bits());
	
	flagreader.add(VersionInfoValid);
	flagreader.add(VersionInfoNotValid);
	if(i.version >= INNO_VERSION(2, 0, 17) && i.version < INNO_VERSION(4, 0, 1)) {
		flagreader.add(BZipped);
	}
	if(i.version >= INNO_VERSION(4, 0, 10)) {
		flagreader.add(TimeStampInUTC);
	}
	if(i.version >= INNO_VERSION(4, 1, 0)) {
		flagreader.add(IsUninstallerExe);
	}
	if(i.version >= INNO_VERSION(4, 1, 8)) {
		flagreader.add(CallInstructionOptimized);
	}
	if(i.version >= INNO_VERSION(4, 2, 0)) {
		flagreader.add(Touch);
	}
	if(i.version >= INNO_VERSION(4, 2, 2)) {
		flagreader.add(ChunkEncrypted);
	}
	if(i.version >= INNO_VERSION(4, 2, 5)) {
		flagreader.add(ChunkCompressed);
	} else {
		options |= ChunkCompressed;
	}
	if(i.version >= INNO_VERSION(5, 1, 13)) {
		flagreader.add(SolidBreak);
	}
	if(i.version >= INNO_VERSION(5, 5, 7) && i.version < INNO_VERSION(6, 3, 0)) {
		// Actually added in Inno Setup 5.5.9 but the data version was not bumped
		flagreader.add(Sign);
		flagreader.add(SignOnce);
	}
	
	options |= flagreader.finalize();
	
	if(i.version >= INNO_VERSION(6, 3, 0)) {
		sign = stored_enum<stored_sign_mode>(is).get();
	} else if(options & SignOnce) {
		sign = Once;
	} else if(options & Sign) {
		sign = Yes;
	} else {
		sign = NoSetting;
	}
	
	if(options & ChunkCompressed) {
		chunk.compression = i.header.compression;
	} else {
		chunk.compression = stream::Stored;
	}
	if(options & BZipped) {
		options |= ChunkCompressed;
		chunk.compression = stream::BZip2;
	}
	
	if(options & ChunkEncrypted) {
		if(i.version >= INNO_VERSION(6, 4, 0)) {
			chunk.encryption = stream::XChaCha20;
		} else if(i.version >= INNO_VERSION(5, 3, 9)) {
			chunk.encryption = stream::ARC4_SHA1;
		} else {
			chunk.encryption = stream::ARC4_MD5;
		}
	} else {
		chunk.encryption = stream::Plaintext;
	}
	
	if(options & CallInstructionOptimized) {
		if(i.version < INNO_VERSION(5, 2, 0)) {
			file.filter = stream::InstructionFilter4108;
		} else if(i.version < INNO_VERSION(5, 3, 9)) {
			file.filter = stream::InstructionFilter5200;
		} else {
			file.filter = stream::InstructionFilter5309;
		}
	} else {
		file.filter = stream::NoFilter;
	}
}